

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceOfLinearExtrusion::IfcSurfaceOfLinearExtrusion
          (IfcSurfaceOfLinearExtrusion *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcSurfaceOfLinearExtrusion";
  IfcSweptSurface::IfcSweptSurface
            (&this->super_IfcSweptSurface,&PTR_construction_vtable_24__00813578);
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x60 = 0;
  (this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x813498;
  *(undefined8 *)&this->field_0x70 = 0x813560;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8134c0;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8134e8;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       0x813510;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x50 = 0x813538;
  return;
}

Assistant:

IfcSurfaceOfLinearExtrusion() : Object("IfcSurfaceOfLinearExtrusion") {}